

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colTrie.c
# Opt level: O3

int Col_TrieMapGet(Col_Word map,Col_Word key,Col_Word *valuePtr)

{
  ulong in_RAX;
  uint uVar1;
  
  if (map == 0) goto LAB_00113b8f;
  if ((map & 0xf) == 0) {
    if ((*(byte *)map & 2) != 0) {
      uVar1 = *(byte *)map & 0xfffffffe;
      goto LAB_00113b60;
    }
LAB_00113b7b:
    in_RAX = TrieMapFindEntry(map,key,0,(int *)0x0,(Col_Word *)0x0,(Col_Word *)0x0);
  }
  else {
    in_RAX = (ulong)((uint)map & 0x1f);
    uVar1 = immediateWordTypes[in_RAX];
LAB_00113b60:
    if (uVar1 == 0xffffffff) goto LAB_00113b7b;
    if (uVar1 != 0x42) goto LAB_00113b8f;
    in_RAX = StringTrieMapFindEntry(map,key,0,(int *)0x0,(Col_Word *)0x0,(Col_Word *)0x0);
  }
  if (in_RAX == 0) {
    return 0;
  }
LAB_00113b8f:
  *valuePtr = *(Col_Word *)(in_RAX + 0x18);
  return 1;
}

Assistant:

int
Col_TrieMapGet(
    Col_Word map,       /*!< Trie map to get entry for. */
    Col_Word key,       /*!< Entry key. Can be any word type, including string,
                             however it must match the actual type used by the
                             map. */

    /*! [out] Returned entry value, if found. */
    Col_Word *valuePtr)
{
    Col_Word entry;

    /*
     * Check preconditions.
     */

    /*! @typecheck{COL_ERROR_WORDTRIEMAP,map} */
    TYPECHECK_WORDTRIEMAP(map) return 0;

    switch (WORD_TYPE(map)) {
    case WORD_TYPE_STRTRIEMAP:
        entry = StringTrieMapFindEntry(map, key, 0, NULL, NULL, NULL);
        break;

    case WORD_TYPE_CUSTOM:
        entry = TrieMapFindEntry(map, key, 0, NULL, NULL, NULL);
        break;

    /* WORD_TYPE_UNKNOWN */

    default:
        /* CANTHAPPEN */
        ASSERT(0);
    }

    if (entry) {
        ASSERT(WORD_TYPE(entry) == WORD_TYPE_TRIELEAF || WORD_TYPE(entry) == WORD_TYPE_MTRIELEAF);
        *valuePtr = WORD_MAPENTRY_VALUE(entry);
        return 1;
    } else {
        return 0;
    }
}